

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O0

QueryId __thiscall
helics::Federate::queryAsync(Federate *this,string_view queryStr,HelicsSequencingModes mode)

{
  string_view message;
  uint val;
  basic_string_view<char,_std::char_traits<char>_> *this_00;
  AsyncFedCallInfo *pAVar1;
  undefined8 in_RCX;
  type *in_RDX;
  long in_RSI;
  IdentifierId<unsigned_int,_(helics::Identifiers)113,_4294967295U> *in_RDI;
  int cnt;
  handle asyncInfo;
  future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> queryFut;
  shared_guarded<helics::AsyncFedCallInfo,_std::mutex> *in_stack_ffffffffffffff28;
  lock_handle<helics::AsyncFedCallInfo,_std::mutex> *this_01;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  int *in_stack_ffffffffffffff38;
  map<int,_std::future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *in_stack_ffffffffffffff40;
  uint uVar2;
  IdentifierId<unsigned_int,_(helics::Identifiers)113,_4294967295U> *pIVar3;
  lock_handle<helics::AsyncFedCallInfo,_std::mutex> local_80;
  
  if ((*(byte *)(in_RSI + 0xe) & 1) != 0) {
    pIVar3 = in_RDI;
    this_00 = (basic_string_view<char,_std::char_traits<char>_> *)__cxa_allocate_exception(0x28);
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (this_00,(char *)in_stack_ffffffffffffff38);
    message._M_str = (char *)pIVar3;
    message._M_len = (size_t)in_RDI;
    InvalidFunctionCall::InvalidFunctionCall((InvalidFunctionCall *)this_00,message);
    __cxa_throw(this_00,&InvalidFunctionCall::typeinfo,InvalidFunctionCall::~InvalidFunctionCall);
  }
  pIVar3 = in_RDI;
  std::
  async_abi_cxx11_<helics::Federate::queryAsync(std::basic_string_view<char,std::char_traits<char>>,HelicsSequencingModes)::__0>
            ((launch)((ulong)in_RCX >> 0x20),in_RDX);
  uVar2 = (uint)pIVar3;
  std::
  unique_ptr<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
  ::operator->((unique_ptr<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
                *)0x35381e);
  gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>::lock
            (in_stack_ffffffffffffff28);
  this_01 = &local_80;
  pAVar1 = gmlc::libguarded::lock_handle<helics::AsyncFedCallInfo,_std::mutex>::operator->(this_01);
  val = std::__atomic_base<int>::operator++(&(pAVar1->queryCounter).super___atomic_base<int>,0);
  gmlc::libguarded::lock_handle<helics::AsyncFedCallInfo,_std::mutex>::operator->(this_01);
  std::
  map<int,std::future<std::__cxx11::string>,std::less<int>,std::allocator<std::pair<int_const,std::future<std::__cxx11::string>>>>
  ::emplace<int&,std::future<std::__cxx11::string>>
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
             (future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
  IdentifierId<unsigned_int,_(helics::Identifiers)113,_4294967295U>::IdentifierId(in_RDI,val);
  gmlc::libguarded::lock_handle<helics::AsyncFedCallInfo,_std::mutex>::~lock_handle
            ((lock_handle<helics::AsyncFedCallInfo,_std::mutex> *)0x3538a4);
  std::future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~future((future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)0x3538b1);
  return (QueryId)uVar2;
}

Assistant:

QueryId Federate::queryAsync(std::string_view queryStr, HelicsSequencingModes mode)
{
    if (singleThreadFederate) {
        throw(helics::InvalidFunctionCall("No Async calls are allowed in single thread federates"));
    }
    auto queryFut =
        std::async(std::launch::async, [this, queryStr, mode]() { return query(queryStr, mode); });
    auto asyncInfo = asyncCallInfo->lock();
    int cnt = asyncInfo->queryCounter++;

    asyncInfo->inFlightQueries.emplace(cnt, std::move(queryFut));
    return QueryId(cnt);
}